

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O0

void spo_shuffle_array(sp_coder *coder)

{
  undefined8 uVar1;
  int iVar2;
  opvar *ov;
  splev_var *psVar3;
  long lVar4;
  long j;
  long i;
  opvar *tmp2;
  splev_var *tmp;
  opvar *vname;
  sp_coder *coder_local;
  
  ov = splev_stack_getdat(coder,'\x02');
  if (((ov != (opvar *)0x0) &&
      (psVar3 = opvar_var_defined(coder,(ov->vardata).str), psVar3 != (splev_var *)0x0)) &&
     (0 < psVar3->array_len)) {
    j = psVar3->array_len;
    while (j = j + -1, 0 < j) {
      iVar2 = rn2((int)j + 1);
      lVar4 = (long)iVar2;
      if (lVar4 != j) {
        uVar1 = *(undefined8 *)(&((psVar3->data).value)->spovartyp + lVar4 * 8);
        *(undefined8 *)(&((psVar3->data).value)->spovartyp + lVar4 * 8) =
             *(undefined8 *)((long)(psVar3->data).value + j * 8);
        *(undefined8 *)((long)(psVar3->data).value + j * 8) = uVar1;
      }
    }
    if (ov == (opvar *)0x0) {
      impossible("opvar_free(), %s","spo_shuffle_array");
    }
    else {
      opvar_free_x(ov);
    }
  }
  return;
}

Assistant:

static void spo_shuffle_array(struct sp_coder *coder)
{
	struct opvar *vname;
	struct splev_var *tmp;
	struct opvar *tmp2;
	long i, j;

	if (!OV_pop_s(vname)) return;

	tmp = opvar_var_defined(coder, OV_s(vname));
	if (!tmp || tmp->array_len < 1)
	    return;

	for (i = tmp->array_len - 1; i > 0; i--) {
	    if ((j = rn2(i + 1)) == i)
		continue;
	    tmp2 = tmp->data.arrayvalues[j];
	    tmp->data.arrayvalues[j] = tmp->data.arrayvalues[i];
	    tmp->data.arrayvalues[i] = tmp2;
	}

	opvar_free(vname);
}